

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  pointer pbVar1;
  double dVar2;
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  ilzham *lzham_dll_00;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  lzham_compress_level lVar6;
  lzham_compress_status_t lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  timer_ticks tVar11;
  FILE *pFVar12;
  __off64_t _Var13;
  __off64_t _Var14;
  timer_ticks tVar15;
  undefined1 recursive;
  ulong in_RCX;
  string_array *files_00;
  undefined2 **ppuVar16;
  allocator<char> *paVar17;
  int iVar18;
  uint uVar19;
  pointer pcVar20;
  undefined8 uVar21;
  char *pMsg;
  char *pcVar22;
  iterator __position;
  ulong uVar23;
  long lVar24;
  comp_options options;
  size_t cmp_len;
  string_array files;
  lzham_uint32 comp_adler32;
  size_t decomp_size;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  undefined4 in_stack_fffffffffffff708;
  uint uVar25;
  bool local_8f0;
  bool bStack_8ef;
  bool bStack_8ee;
  bool bStack_8ed;
  undefined4 local_8ec;
  comp_options local_8e8;
  ilzham *local_8c8;
  ulong local_8c0;
  string local_8b8;
  long local_898;
  long local_890;
  uint local_884;
  lzham_uint32 local_880;
  lzham_uint32 local_87c;
  size_t local_878;
  undefined7 uStack_870;
  undefined1 uStack_869;
  undefined3 uStack_868;
  timer_ticks local_860;
  string local_858;
  undefined2 *local_838;
  undefined8 local_830;
  undefined2 local_828;
  undefined6 uStack_826;
  allocator<char> local_438 [1032];
  
  lVar6 = LZHAM_COMP_LEVEL_UBER;
  iVar8 = 0x1c;
  uVar25 = CONCAT31(SUB43(in_stack_fffffffffffff708,1),1);
  local_8f0 = false;
  bStack_8ef = false;
  bStack_8ee = false;
  bStack_8ed = false;
  local_8ec = local_8ec & 0xffff0000;
  __position._M_current =
       (cmd_line->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current;
  if (uVar10 == 0) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    local_858.field_2._8_4_ = 0;
    local_858.field_2._M_allocated_capacity = 0;
    local_858._M_dataplus._M_p = (pointer)0x1c0000001c;
    local_858._M_string_length = 0x100000004;
    local_8e8.m_comp_level = 0x400;
    local_8e8.m_dict_size_log2 = 0;
    local_87c = 0;
    lVar7 = (*lzham_dll->lzham_compress_memory)
                      ((lzham_compress_params *)&local_858,(lzham_uint8 *)&local_838,
                       (size_t *)&local_8e8,
                       (lzham_uint8 *)
                       "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                       ,0x58,&local_87c);
    if (lVar7 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,local_8e8._0_8_ & 0xffffffff);
      local_8b8._M_dataplus._M_p._4_4_ = iVar8;
      local_8b8._M_dataplus._M_p._0_4_ = 0x10;
      local_8b8._M_string_length = ((ulong)uVar25 & 0xff) << 0x20;
      local_878 = 0x400;
      local_880 = 0;
      lVar7 = (*lzham_dll->lzham_decompress_memory)
                        ((lzham_decompress_params *)&local_8b8,(lzham_uint8 *)local_438,&local_878,
                         (lzham_uint8 *)&local_838,local_8e8._0_8_,&local_880);
      if (lVar7 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (((local_87c == local_880) && (local_878 == 0x58)) &&
           (iVar8 = bcmp(local_438,
                         "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                         ,0x58), iVar8 == 0)) {
          puts("Compression test succeeded.");
          return 0;
        }
        pcVar22 = "Compression test failed!\n";
LAB_00107f4f:
        print_error(pcVar22);
        return 1;
      }
    }
    print_error("Compression test failed with status %i!\n",(ulong)lVar7);
  }
  else {
    iVar5 = (int)(uVar10 >> 5);
    local_8c8 = lzham_dll;
    uVar19 = local_8ec;
    while (0 < iVar5) {
      recursive = (undefined1)in_RCX;
      pcVar22 = ((__position._M_current)->_M_dataplus)._M_p;
      if (*pcVar22 != 0x2d) {
        if ((__position._M_current)->_M_string_length != 1) {
LAB_00107f0c:
          pMsg = "Invalid mode: %s\n";
          goto LAB_00107f25;
        }
        iVar5 = tolower((int)*pcVar22);
        if (iVar5 == 0x61) {
          iVar18 = 2;
        }
        else {
          iVar18 = 0;
          if (iVar5 != 99) {
            if (iVar5 != 100) goto LAB_00107f0c;
            iVar18 = 1;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(cmd_line,__position);
        puts("Using options:");
        comp_options::print((comp_options *)&stack0xfffffffffffff700);
        putchar(10);
        pbVar1 = (cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(cmd_line->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
        if (iVar18 == 2) {
          if ((long)uVar10 >> 5 == 1) {
            paVar17 = (allocator<char> *)(pbVar1->_M_dataplus)._M_p;
            local_878 = CONCAT44(iVar8,lVar6);
            uStack_870 = (undefined7)CONCAT44(num_helper_threads,uVar25);
            uStack_869 = (undefined1)((uint)num_helper_threads >> 0x18);
            _uStack_869 = CONCAT31(CONCAT12(bStack_8ee,CONCAT11(bStack_8ef,local_8f0)),uStack_869);
            local_8b8._M_dataplus._M_p = (pointer)0x0;
            local_8b8._M_string_length = 0;
            local_8b8.field_2._M_allocated_capacity = 0;
            local_884 = uVar19;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_858,(char *)paVar17,local_438);
            local_828 = 0x2a;
            local_830 = 1;
            local_838 = &local_828;
            bVar4 = find_files(&local_858,&local_8b8,files_00,(bool)recursive);
            if (local_838 != &local_828) {
              operator_delete(local_838,CONCAT62(uStack_826,local_828) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_858._M_dataplus._M_p != &local_858.field_2) {
              operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar4) {
              pcVar22 = "Failed finding files under path \"%s\"!\n";
              goto LAB_00108001;
            }
            tVar15 = timer::get_ticks();
            tVar11 = timer::get_init_ticks();
            local_860 = tVar15;
            sprintf((char *)&local_838,"__comp_temp_%u__.tmp",tVar11 & 0xffffffff);
            sprintf((char *)local_438,"__decomp_temp_%u__.tmp",tVar11 & 0xffffffff);
            if (local_8b8._M_string_length - (long)local_8b8._M_dataplus._M_p != 0) {
              uVar10 = (long)(local_8b8._M_string_length - (long)local_8b8._M_dataplus._M_p) >> 5;
              uVar19 = 1;
              uVar23 = 0;
              local_8c0 = 0;
              local_898 = 0;
              local_890 = 0;
              goto LAB_00107ae5;
            }
            local_8c0 = 0;
            local_890 = 0;
            local_898 = 0;
            goto LAB_00107e76;
          }
          if ((long)uVar10 >> 5 == 0) {
            pcVar22 = "No directory specified!\n";
            goto LAB_00107f4f;
          }
        }
        else if (iVar18 == 1) {
          if (uVar10 < 0x21) {
LAB_00107f31:
            pcVar22 = "Must specify input and output filenames!\n";
            goto LAB_00107f4f;
          }
          if (uVar10 == 0x40) {
            options_00.m_dict_size_log2._3_1_ = in_stack_fffffffffffff6ff;
            options_00._0_7_ = in_stack_fffffffffffff6f8;
            options_00._8_4_ = lVar6;
            options_00.m_max_helper_threads = iVar8;
            options_00.m_unbuffered_decompression = (bool)(char)uVar25;
            options_00.m_verify_compressed_data = (bool)(char)(uVar25 >> 8);
            options_00.m_force_polar_codes = (bool)(char)(uVar25 >> 0x10);
            options_00.m_randomize_params = (bool)(char)(uVar25 >> 0x18);
            options_00.m_extreme_parsing = (bool)(char)num_helper_threads;
            options_00.m_deterministic_parsing = (bool)(char)((uint)num_helper_threads >> 8);
            options_00._22_2_ = (short)((uint)num_helper_threads >> 0x10);
            bVar4 = decompress_file(local_8c8,(pbVar1->_M_dataplus)._M_p,pbVar1[1]._M_dataplus._M_p,
                                    options_00);
            return (uint)!bVar4;
          }
        }
        else {
          if (uVar10 < 0x21) goto LAB_00107f31;
          if (uVar10 == 0x40) {
            bVar4 = compress_streaming(local_8c8,(pbVar1->_M_dataplus)._M_p,
                                       pbVar1[1]._M_dataplus._M_p,
                                       (comp_options *)&stack0xfffffffffffff700);
            if (!bVar4) {
              return 1;
            }
            if (bStack_8ef == true) {
              tVar15 = timer::get_ticks();
              dVar2 = timer::ticks_to_secs(tVar15);
              sprintf((char *)&local_838,"__decomp_temp_%u__.tmp",(long)(dVar2 * 1000.0));
              options_02.m_dict_size_log2._3_1_ = in_stack_fffffffffffff6ff;
              options_02._0_7_ = in_stack_fffffffffffff6f8;
              options_02._8_4_ = lVar6;
              options_02.m_max_helper_threads = iVar8;
              options_02.m_unbuffered_decompression = (bool)(char)uVar25;
              options_02.m_verify_compressed_data = (bool)(char)(uVar25 >> 8);
              options_02.m_force_polar_codes = (bool)(char)(uVar25 >> 0x10);
              options_02.m_randomize_params = (bool)(char)(uVar25 >> 0x18);
              options_02.m_extreme_parsing = (bool)(char)num_helper_threads;
              options_02.m_deterministic_parsing = (bool)(char)((uint)num_helper_threads >> 8);
              options_02._22_2_ = (short)((uint)num_helper_threads >> 0x10);
              bVar4 = decompress_file(local_8c8,pbVar1[1]._M_dataplus._M_p,(char *)&local_838,
                                      options_02);
              if (bVar4) {
                printf("Comparing file \"%s\" to \"%s\"\n",&local_838,(pbVar1->_M_dataplus)._M_p);
                bVar4 = compare_files((char *)&local_838,(pbVar1->_M_dataplus)._M_p);
                if (bVar4) {
                  puts("Decompressed file compared OK to original file.");
                  remove((char *)&local_838);
                  return 0;
                }
                pcVar20 = (pbVar1->_M_dataplus)._M_p;
                ppuVar16 = (undefined2 **)pbVar1[1]._M_dataplus._M_p;
                pcVar22 = 
                "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
              }
              else {
                pcVar20 = pbVar1[1]._M_dataplus._M_p;
                pcVar22 = "Failed decompressing file \"%s\" to \"%s\"\n";
                ppuVar16 = &local_838;
              }
              print_error(pcVar22,pcVar20,ppuVar16);
              return 1;
            }
            return 0;
          }
        }
        pcVar22 = "Too many filenames!\n";
        goto LAB_00107f4f;
      }
      if ((__position._M_current)->_M_string_length < 2) {
switchD_001076a7_caseD_66:
        pMsg = "Invalid option: %s\n";
LAB_00107f25:
        print_error(pMsg,pcVar22);
        return 1;
      }
      iVar5 = tolower((int)pcVar22[1]);
      local_8ec = uVar19;
      switch(iVar5) {
      case 99:
        uVar25 = uVar25 & 0xffffff00;
        break;
      case 100:
        iVar8 = atoi(pcVar22 + 2);
        in_RCX = (ulong)(iVar8 - 0xfU);
        if (0xe < iVar8 - 0xfU) {
          pMsg = "Invalid dictionary size: %s\n";
          goto LAB_00107f25;
        }
        break;
      case 0x65:
        local_8ec._2_2_ = (undefined2)(uVar19 >> 0x10);
        local_8ec._0_2_ = CONCAT11(true,SUB41(uVar19,0));
        break;
      default:
        goto switchD_001076a7_caseD_66;
      case 0x6d:
        lVar6 = atoi(pcVar22 + 2);
        if (LZHAM_COMP_LEVEL_UBER < lVar6) {
          pMsg = "Invalid compression level: %s\n";
          goto LAB_00107f25;
        }
        break;
      case 0x70:
        bStack_8ee = true;
        break;
      case 0x72:
        bStack_8ed = true;
        break;
      case 0x73:
        uVar19 = atoi(pcVar22 + 2);
        srand(uVar19);
        printf("Using random seed: %i\n",(ulong)uVar19);
        __position._M_current =
             (cmd_line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        break;
      case 0x74:
        num_helper_threads = atoi(pcVar22 + 2);
        if (0x10 < (uint)num_helper_threads) {
          pMsg = "Invalid number of helper threads: %s\n";
          goto LAB_00107f25;
        }
        break;
      case 0x75:
        local_8f0 = true;
        break;
      case 0x76:
        bStack_8ef = true;
        break;
      case 0x78:
        local_8ec = CONCAT31((int3)(uVar19 >> 8),1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(cmd_line,__position);
      __position._M_current =
           (cmd_line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      uVar19 = local_8ec;
      iVar5 = (int)((ulong)((long)(cmd_line->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)__position._M_current) >> 5);
    }
    print_error("No mode specified!\n");
    print_usage();
  }
  return 1;
LAB_00107ae5:
  _Var3._M_p = local_8b8._M_dataplus._M_p;
  lVar24 = uVar23 * 0x20;
  pcVar20 = local_8b8._M_dataplus._M_p + lVar24;
  printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",(ulong)uVar19,uVar10,
         *(undefined8 *)(local_8b8._M_dataplus._M_p + lVar24),&local_838);
  pFVar12 = fopen64(*(char **)(_Var3._M_p + lVar24),"rb");
  if (pFVar12 == (FILE *)0x0) {
    printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar20);
  }
  else {
    fseek(pFVar12,0,2);
    _Var13 = ftello64(pFVar12);
    fclose(pFVar12);
    bVar4 = ensure_file_is_writable((char *)&local_838);
    lzham_dll_00 = local_8c8;
    if (!bVar4) {
      pcVar22 = "Unable to create file \"%s\"!\n";
      paVar17 = (allocator<char> *)&local_838;
      goto LAB_00108001;
    }
    local_8e8.m_unbuffered_decompression = SUB41((uint)_uStack_869 >> 8,0);
    local_8e8.m_verify_compressed_data = SUB41((uint)_uStack_869 >> 0x10,0);
    local_8e8.m_force_polar_codes = SUB41((uint)_uStack_869 >> 0x18,0);
    local_8e8.m_comp_level = (undefined4)local_878;
    local_8e8.m_dict_size_log2 = local_878._4_4_;
    local_8e8._8_4_ = SUB74(uStack_870,0);
    local_8e8.m_max_helper_threads = (int)(CONCAT17(uStack_869,uStack_870) >> 0x20);
    local_8e8.m_extreme_parsing = (bool)(undefined1)local_884;
    local_8e8.m_deterministic_parsing = (bool)local_884._1_1_;
    local_8e8._22_2_ = local_884._2_2_;
    local_8e8.m_randomize_params = bStack_8ed;
    if ((bStack_8ed & 1U) != 0) {
      uVar9 = rand();
      local_8e8.m_comp_level = uVar9 % 5;
      iVar5 = rand();
      local_8e8.m_dict_size_log2 = iVar5 % 0xf + 0xf;
      local_8e8.m_max_helper_threads = rand();
      local_8e8.m_max_helper_threads = local_8e8.m_max_helper_threads % 0x11;
      iVar5 = rand();
      local_8e8.m_unbuffered_decompression = (bool)((byte)iVar5 & 1);
      iVar5 = rand();
      local_8e8.m_force_polar_codes = (bool)((byte)iVar5 & 1);
      iVar5 = rand();
      local_8e8._20_4_ =
           CONCAT22(local_8e8._22_2_,CONCAT11((char)iVar5,local_8e8.m_extreme_parsing)) & 0xffff01ff
      ;
      comp_options::print(&local_8e8);
    }
    bVar4 = compress_streaming(lzham_dll_00,*(char **)pcVar20,(char *)&local_838,&local_8e8);
    if (!bVar4) {
      uVar21 = *(undefined8 *)pcVar20;
      pcVar22 = "Failed compressing file \"%s\" to \"%s\"\n";
LAB_0010802c:
      paVar17 = (allocator<char> *)&local_838;
LAB_00108034:
      print_error(pcVar22,uVar21,paVar17);
      goto LAB_0010803b;
    }
    if (local_8e8.m_verify_compressed_data == true) {
      printf("Decompressing file \"%s\" to \"%s\"\n",&local_838,local_438);
      bVar4 = ensure_file_is_writable((char *)local_438);
      if (!bVar4) {
        pcVar22 = "Unable to create file \"%s\"!\n";
        paVar17 = local_438;
LAB_00108001:
        print_error(pcVar22,paVar17);
LAB_0010803b:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_8b8);
        return 1;
      }
      options_01.m_dict_size_log2._3_1_ = bStack_8ed;
      options_01._0_7_ = in_stack_fffffffffffff6f8;
      options_01._8_4_ = lVar6;
      options_01.m_max_helper_threads = iVar8;
      options_01.m_unbuffered_decompression = (bool)(char)uVar25;
      options_01.m_verify_compressed_data = (bool)(char)(uVar25 >> 8);
      options_01.m_force_polar_codes = (bool)(char)(uVar25 >> 0x10);
      options_01.m_randomize_params = (bool)(char)(uVar25 >> 0x18);
      options_01.m_extreme_parsing = (bool)(char)num_helper_threads;
      options_01.m_deterministic_parsing = (bool)(char)((uint)num_helper_threads >> 8);
      options_01._22_2_ = (short)((uint)num_helper_threads >> 0x10);
      bVar4 = decompress_file(lzham_dll_00,(char *)&local_838,(char *)local_438,options_01);
      uVar21 = *(undefined8 *)pcVar20;
      if (!bVar4) {
        pcVar22 = "Failed decompressing file \"%s\" to \"%s\"\n";
        paVar17 = local_438;
        goto LAB_00108034;
      }
      printf("Comparing file \"%s\" to \"%s\"\n",local_438);
      bVar4 = compare_files((char *)local_438,*(char **)pcVar20);
      if (!bVar4) {
        uVar21 = *(undefined8 *)pcVar20;
        pcVar22 = "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
        goto LAB_0010802c;
      }
      puts("Decompressed file compared OK to original file.");
    }
    pFVar12 = fopen64((char *)&local_838,"rb");
    if (pFVar12 == (FILE *)0x0) {
      _Var14 = 0;
    }
    else {
      fseek(pFVar12,0,2);
      _Var14 = ftello64(pFVar12);
      fclose(pFVar12);
    }
    local_8c0 = (ulong)((int)local_8c0 + 1);
    local_898 = local_898 + _Var13;
    local_890 = local_890 + _Var14;
    putchar(10);
  }
  uVar23 = (ulong)uVar19;
  uVar10 = (long)(local_8b8._M_string_length - (long)local_8b8._M_dataplus._M_p) >> 5;
  uVar19 = uVar19 + 1;
  if (uVar10 <= uVar23) {
LAB_00107e76:
    tVar15 = timer::get_ticks();
    dVar2 = timer::ticks_to_secs(tVar15 - local_860);
    printf("Test successful: %f secs\n",SUB84(dVar2,0));
    printf("Total files processed: %u\n",local_8c0);
    printf("Total source size: %llu\n",local_898);
    printf("Total compressed size: %llu\n",local_890);
    remove((char *)&local_838);
    remove((char *)local_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_8b8);
    return 0;
  }
  goto LAB_00107ae5;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (tolower(str[1]))
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'p':
            {
               options.m_force_polar_codes = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;
               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_streaming(lzham_dll, src_file.c_str(), cmp_file.c_str(), options);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}